

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O1

int GetAlphaSourceRow(VP8Io *io,uint8_t **alpha,int *num_rows)

{
  int iVar1;
  int iVar2;
  
  iVar2 = io->mb_y;
  iVar1 = io->mb_h;
  *num_rows = iVar1;
  if (io->fancy_upsampling != 0) {
    if (iVar2 == 0) {
      *num_rows = iVar1 + -1;
      iVar2 = 0;
    }
    else {
      iVar2 = iVar2 + -1;
      *alpha = *alpha + -(long)io->width;
    }
    if (io->mb_y + io->crop_top + io->mb_h == io->crop_bottom) {
      *num_rows = io->crop_bottom - (io->crop_top + iVar2);
    }
  }
  return iVar2;
}

Assistant:

static int GetAlphaSourceRow(const VP8Io* const io,
                             const uint8_t** alpha, int* const num_rows) {
  int start_y = io->mb_y;
  *num_rows = io->mb_h;

  // Compensate for the 1-line delay of the fancy upscaler.
  // This is similar to EmitFancyRGB().
  if (io->fancy_upsampling) {
    if (start_y == 0) {
      // We don't process the last row yet. It'll be done during the next call.
      --*num_rows;
    } else {
      --start_y;
      // Fortunately, *alpha data is persistent, so we can go back
      // one row and finish alpha blending, now that the fancy upscaler
      // completed the YUV->RGB interpolation.
      *alpha -= io->width;
    }
    if (io->crop_top + io->mb_y + io->mb_h == io->crop_bottom) {
      // If it's the very last call, we process all the remaining rows!
      *num_rows = io->crop_bottom - io->crop_top - start_y;
    }
  }
  return start_y;
}